

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  parasail_result_t *result;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  ulong uVar12;
  __m128i *palVar13;
  parasail_result_t *ppVar14;
  __m128i *palVar15;
  long lVar16;
  long lVar17;
  parasail_result_t *ppVar18;
  parasail_result_t *ppVar19;
  char *pcVar20;
  longlong lVar21;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  int iVar22;
  ulong size;
  long lVar23;
  char *__format;
  ulong uVar24;
  parasail_result_t *ppVar25;
  ulong uVar27;
  undefined8 uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar39 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar48 [16];
  undefined1 extraout_XMM0_01 [16];
  ulong uVar55;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar54 [16];
  __m128i_64_t B;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i_64_t B_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m128i_64_t B_4;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  long lVar71;
  longlong lVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i_64_t B_5;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  __m128i_64_t B_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i alVar90;
  __m128i alVar91;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i *local_2a0;
  __m128i *local_298;
  __m128i *local_290;
  __m128i *local_288;
  parasail_result_t *local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  __m128i *local_258;
  __m128i *local_250;
  parasail_result_t *local_248;
  __m128i *local_240;
  undefined1 local_238 [16];
  __m128i *local_228;
  __m128i *local_218;
  parasail_result_t *local_210;
  undefined1 local_208 [16];
  ulong local_1f8;
  __m128i *local_1e8;
  int local_1a8;
  long local_198;
  longlong local_180;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  long local_118;
  long lStack_110;
  ulong uStack_e0;
  long local_d8;
  long lStack_d0;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong uVar26;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
LAB_006935c1:
    fprintf(_stderr,__format,"parasail_sw_stats_table_striped_profile_sse41_128_64",pcVar20);
    return (parasail_result_t *)0x0;
  }
  pvVar3 = (profile->profile64).score;
  if (pvVar3 == (void *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile->profile64.score";
    goto LAB_006935c1;
  }
  ppVar4 = profile->matrix;
  if (ppVar4 == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile->matrix";
    goto LAB_006935c1;
  }
  uVar9 = (ulong)(uint)profile->s1Len;
  if (profile->s1Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar20 = "profile->s1Len";
    goto LAB_006935c1;
  }
  if (s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "s2";
    goto LAB_006935c1;
  }
  uVar24 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar20 = "s2Len";
    goto LAB_006935c1;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar20 = "open";
    goto LAB_006935c1;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar20 = "gap";
    goto LAB_006935c1;
  }
  pvVar5 = (profile->profile64).matches;
  pvVar6 = (profile->profile64).similar;
  iVar8 = ppVar4->max;
  result = parasail_result_new_table3((uint)(uVar9 + 1) & 0x7ffffffe,s2Len);
  if (result == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  size = uVar9 + 1 >> 1;
  result->flag = result->flag | 0x2830804;
  local_240 = parasail_memalign___m128i(0x10,size);
  alVar91[0] = parasail_memalign___m128i(0x10,size);
  local_280 = (parasail_result_t *)parasail_memalign___m128i(0x10,size);
  ppVar10 = (parasail_result_t *)parasail_memalign___m128i(0x10,size);
  local_288 = parasail_memalign___m128i(0x10,size);
  local_298 = parasail_memalign___m128i(0x10,size);
  local_290 = parasail_memalign___m128i(0x10,size);
  palVar11 = parasail_memalign___m128i(0x10,size);
  b = parasail_memalign___m128i(0x10,size);
  b_00 = parasail_memalign___m128i(0x10,size);
  b_01 = parasail_memalign___m128i(0x10,size);
  b_02 = parasail_memalign___m128i(0x10,size);
  local_2a0 = parasail_memalign___m128i(0x10,size);
  local_210 = (parasail_result_t *)parasail_memalign___m128i(0x10,size);
  local_1e8 = parasail_memalign___m128i(0x10,size);
  local_218 = parasail_memalign___m128i(0x10,size);
  auVar39._0_8_ = -(ulong)(local_240 == (__m128i *)0x0);
  auVar39._8_8_ = -(ulong)(alVar91[0] == (__m128i *)0x0);
  auVar78._0_8_ = -(ulong)(local_280 == (parasail_result_t *)0x0);
  auVar78._8_8_ = -(ulong)(ppVar10 == (parasail_result_t *)0x0);
  auVar39 = packssdw(auVar39,auVar78);
  auVar63._0_8_ = -(ulong)(local_288 == (__m128i *)0x0);
  auVar63._8_8_ = -(ulong)(local_298 == (__m128i *)0x0);
  auVar79._0_8_ = -(ulong)(local_290 == (__m128i *)0x0);
  auVar79._8_8_ = -(ulong)(palVar11 == (__m128i *)0x0);
  auVar59 = packssdw(auVar63,auVar79);
  auVar39 = packssdw(auVar39,auVar59);
  auVar59._0_8_ = -(ulong)(b == (__m128i *)0x0);
  auVar59._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
  auVar73._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
  auVar73._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
  auVar59 = packssdw(auVar59,auVar73);
  auVar66._0_8_ = -(ulong)(local_2a0 == (__m128i *)0x0);
  auVar66._8_8_ = -(ulong)(local_210 == (parasail_result_t *)0x0);
  auVar74._0_8_ = -(ulong)(local_1e8 == (__m128i *)0x0);
  auVar74._8_8_ = -(ulong)(local_218 == (__m128i *)0x0);
  auVar63 = packssdw(auVar66,auVar74);
  auVar59 = packssdw(auVar59,auVar63);
  auVar39 = packsswb(auVar39,auVar59);
  if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar39 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar39 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar39 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar39 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar39 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  local_1f8 = 0;
  uVar36 = (ulong)(uint)gap;
  alVar90[1] = 0x7fffffffffffffff;
  alVar90[0] = size;
  palVar13 = alVar91[0];
  parasail_memset___m128i(local_240,alVar90,(size_t)alVar91[0]);
  c[1] = extraout_RDX;
  c[0] = size;
  parasail_memset___m128i((__m128i *)local_280,c,(size_t)palVar13);
  c_00[1] = extraout_RDX_00;
  c_00[0] = size;
  parasail_memset___m128i(local_288,c_00,(size_t)palVar13);
  c_01[1] = extraout_RDX_01;
  c_01[0] = size;
  parasail_memset___m128i(local_290,c_01,(size_t)palVar13);
  c_02[1] = extraout_RDX_02;
  c_02[0] = size;
  parasail_memset___m128i(b,c_02,(size_t)palVar13);
  c_03[1] = extraout_RDX_03;
  c_03[0] = size;
  parasail_memset___m128i(b_00,c_03,(size_t)palVar13);
  c_04[1] = extraout_RDX_04;
  c_04[0] = size;
  parasail_memset___m128i(b_01,c_04,(size_t)palVar13);
  pmovsxbq(extraout_XMM0,0x101);
  c_05[1] = extraout_RDX_05;
  c_05[0] = size;
  parasail_memset___m128i(b_02,c_05,(size_t)palVar13);
  uVar7 = (uint)size;
  uVar12 = (ulong)(uVar7 - 1);
  ppVar25 = (parasail_result_t *)(size * uVar24 * 4);
  local_198 = 0;
  local_238 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_180 = 0;
  lVar16 = -0x4000000000000000;
  for (uVar27 = 0; uVar27 != uVar24; uVar27 = uVar27 + 1) {
    lVar21 = local_240[uVar12][0];
    lVar38 = *(long *)(&local_280->score + uVar12 * 4);
    lVar76 = local_288[uVar12][0];
    lVar34 = 0;
    lVar17 = (long)(int)(ppVar4->mapper[(byte)s2[uVar27]] * uVar7) * 0x10;
    ppVar18 = (parasail_result_t *)(lVar17 + (long)pvVar6);
    local_1a8 = (int)uVar27;
    bVar35 = (int)local_1f8 == local_1a8 + -2;
    palVar13 = local_218;
    if (bVar35) {
      palVar13 = palVar11;
    }
    lVar33 = 0;
    ppVar14 = local_210;
    if (bVar35) {
      ppVar14 = ppVar10;
    }
    lVar71 = 0;
    local_258 = palVar11;
    if (bVar35) {
      local_258 = local_218;
    }
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_290[uVar12][0];
    auVar68 = auVar68 << 0x40;
    palVar15 = alVar91[0];
    local_250 = local_298;
    local_248 = ppVar10;
    if (bVar35) {
      palVar15 = local_2a0;
      local_250 = local_1e8;
      local_248 = local_210;
    }
    local_268 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    lVar23 = 0;
    auVar39 = ZEXT816(0);
    ppVar19 = ppVar18;
    uVar26 = uVar27;
    lVar32 = local_198;
    auVar83 = _DAT_008a1f70;
    while( true ) {
      uStack_60 = (ulong)(uint)open;
      uStack_e0 = (ulong)(uint)gap;
      if (size << 4 == lVar23) break;
      auVar59 = *(undefined1 (*) [16])((long)*b + lVar23);
      auVar63 = *(undefined1 (*) [16])((long)*b_00 + lVar23);
      plVar1 = (long *)((long)pvVar3 + lVar23 + lVar17);
      auVar40._0_8_ = lVar34 + *plVar1;
      auVar40._8_8_ = lVar21 + plVar1[1];
      auVar66 = *(undefined1 (*) [16])((long)*b_01 + lVar23);
      auVar60._0_8_ = -(ulong)(0 < auVar40._0_8_);
      auVar60._8_8_ = -(ulong)(0 < auVar40._8_8_);
      auVar60 = auVar60 & auVar40;
      auVar41._0_8_ = -(ulong)(auVar59._0_8_ < auVar60._0_8_);
      auVar41._8_8_ = -(ulong)(auVar59._8_8_ < auVar60._8_8_);
      auVar78 = blendvpd(auVar59,auVar60,auVar41);
      auVar64._0_8_ = -(ulong)(local_278._0_8_ < auVar78._0_8_);
      auVar64._8_8_ = -(ulong)(local_278._8_8_ < auVar78._8_8_);
      auVar86 = blendvpd(local_278,auVar78,auVar64);
      auVar78 = *(undefined1 (*) [16])((long)*b_02 + lVar23);
      *(undefined1 (*) [16])((long)*palVar15 + lVar23) = auVar86;
      auVar79 = blendvpd(local_268,auVar63,auVar64);
      plVar1 = (long *)((long)pvVar5 + lVar23 + lVar17);
      auVar77._0_8_ = lVar33 + *plVar1;
      auVar77._8_8_ = lVar38 + plVar1[1];
      lVar34 = auVar86._0_8_;
      auVar61._0_8_ = -(ulong)(auVar60._0_8_ == lVar34);
      lVar33 = auVar86._8_8_;
      auVar61._8_8_ = -(ulong)(auVar60._8_8_ == lVar33);
      auVar80 = blendvpd(auVar79,auVar77,auVar61);
      auVar89._0_8_ = -(ulong)(lVar34 == 0);
      auVar89._8_8_ = -(ulong)(lVar33 == 0);
      auVar80 = ~auVar89 & auVar80;
      auVar79 = blendvpd(auVar39,auVar66,auVar64);
      *(undefined1 (*) [16])((long)&local_248->score + lVar23) = auVar80;
      plVar1 = (long *)((long)&ppVar18->score + lVar23);
      auVar72._0_8_ = lVar71 + *plVar1;
      auVar72._8_8_ = lVar76 + plVar1[1];
      auVar79 = blendvpd(auVar79,auVar72,auVar61);
      auVar73 = blendvpd(auVar83,auVar78,auVar64);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar69._0_8_ = auVar68._0_8_ + 1;
      auVar69._8_8_ = auVar68._8_8_ - auVar42._8_8_;
      auVar74 = blendvpd(auVar73,auVar69,auVar61);
      auVar79 = ~auVar89 & auVar79;
      *(undefined1 (*) [16])((long)*local_250 + lVar23) = auVar79;
      auVar74 = ~auVar89 & auVar74;
      *(undefined1 (*) [16])((long)*local_258 + lVar23) = auVar74;
      lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
      *(int *)(lVar38 + lVar32) = auVar80._0_4_;
      *(int *)((long)&ppVar25->score + lVar38 + lVar32) = auVar80._8_4_;
      lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
      *(int *)(lVar38 + lVar32) = auVar79._0_4_;
      *(int *)((long)&ppVar25->score + lVar38 + lVar32) = auVar79._8_4_;
      lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
      *(int *)(lVar38 + lVar32) = auVar74._0_4_;
      *(int *)((long)&ppVar25->score + lVar38 + lVar32) = auVar74._8_4_;
      lVar38 = *((result->field_4).trace)->trace_del_table;
      *(int *)(lVar38 + lVar32) = auVar86._0_4_;
      *(int *)((long)&ppVar25->score + lVar38 + lVar32) = auVar86._8_4_;
      auVar43._0_8_ = -(ulong)(auVar80._0_8_ < local_208._0_8_);
      auVar43._8_8_ = -(ulong)(auVar80._8_8_ < local_208._8_8_);
      auVar73 = blendvpd(auVar80,local_208,auVar43);
      auVar44._0_8_ = -(ulong)(auVar79._0_8_ < auVar73._0_8_);
      auVar44._8_8_ = -(ulong)(auVar79._8_8_ < auVar73._8_8_);
      auVar73 = blendvpd(auVar79,auVar73,auVar44);
      auVar45._0_8_ = -(ulong)(auVar74._0_8_ < auVar73._0_8_);
      auVar45._8_8_ = -(ulong)(auVar74._8_8_ < auVar73._8_8_);
      local_208 = blendvpd(auVar74,auVar73,auVar45);
      auVar46._0_8_ = -(ulong)(local_238._0_8_ < lVar34);
      auVar46._8_8_ = -(ulong)(local_238._8_8_ < lVar33);
      local_238 = blendvpd(local_238,auVar86,auVar46);
      auVar87._0_8_ = lVar34 - (ulong)(uint)open;
      auVar87._8_8_ = lVar33 - uStack_60;
      auVar56._0_8_ = auVar59._0_8_ - uVar36;
      auVar56._8_8_ = auVar59._8_8_ - uStack_e0;
      auVar47._0_8_ = -(ulong)(auVar56._0_8_ < auVar87._0_8_);
      auVar47._8_8_ = -(ulong)(auVar56._8_8_ < auVar87._8_8_);
      auVar73 = blendvpd(auVar56,auVar87,auVar47);
      a[1] = (longlong)ppVar25;
      a[0] = uVar26;
      b_03[1] = (longlong)result;
      b_03[0] = (longlong)alVar91[0];
      ppVar19 = result;
      ppVar10 = ppVar25;
      alVar90 = _mm_cmpgt_epi64_rpl(a,b_03);
      b_04[0] = alVar90[1];
      auVar59 = pblendvb(auVar63,auVar80,extraout_XMM0_00);
      auVar63 = pblendvb(auVar66,auVar79,extraout_XMM0_00);
      local_118 = auVar78._0_8_;
      lStack_110 = auVar78._8_8_;
      auVar70._8_4_ = 0xffffffff;
      auVar70._0_8_ = 0xffffffffffffffff;
      auVar70._12_4_ = 0xffffffff;
      auVar65._0_8_ = local_118 + 1;
      auVar65._8_8_ = lStack_110 - auVar70._8_8_;
      auVar75._0_8_ = auVar74._0_8_ + 1;
      auVar75._8_8_ = auVar74._8_8_ - auVar70._8_8_;
      auVar66 = pblendvb(auVar65,auVar75,extraout_XMM0_00);
      local_58 = auVar73._0_8_;
      uStack_50 = auVar73._8_8_;
      puVar2 = (undefined8 *)((long)*b + lVar23);
      *puVar2 = local_58;
      puVar2[1] = uStack_50;
      *(undefined1 (*) [16])((long)*b_00 + lVar23) = auVar59;
      *(undefined1 (*) [16])((long)*b_01 + lVar23) = auVar63;
      *(undefined1 (*) [16])((long)*b_02 + lVar23) = auVar66;
      auVar67._0_8_ = local_278._0_8_ - uVar36;
      auVar67._8_8_ = local_278._8_8_ - uStack_e0;
      auVar48._0_8_ = -(ulong)(auVar67._0_8_ < auVar87._0_8_);
      auVar48._8_8_ = -(ulong)(auVar67._8_8_ < auVar87._8_8_);
      local_278 = blendvpd(auVar67,auVar87,auVar48);
      a_00[1] = (longlong)ppVar10;
      a_00[0] = uVar26;
      b_04[1] = (longlong)ppVar19;
      _mm_cmpgt_epi64_rpl(a_00,b_04);
      local_d8 = auVar83._0_8_;
      lStack_d0 = auVar83._8_8_;
      local_268 = pblendvb(local_268,auVar80,extraout_XMM0_01);
      auVar39 = pblendvb(auVar39,auVar79,extraout_XMM0_01);
      auVar82._0_8_ = local_d8 + 1;
      auVar82._8_8_ = lStack_d0 + 1;
      auVar83 = pblendvb(auVar82,auVar75,extraout_XMM0_01);
      plVar1 = (long *)((long)*local_240 + lVar23);
      lVar34 = *plVar1;
      lVar21 = plVar1[1];
      plVar1 = (long *)((long)&local_280->score + lVar23);
      lVar33 = *plVar1;
      lVar38 = plVar1[1];
      plVar1 = (long *)((long)*local_288 + lVar23);
      lVar71 = *plVar1;
      lVar76 = plVar1[1];
      auVar68 = *(undefined1 (*) [16])((long)*local_290 + lVar23);
      lVar23 = lVar23 + 0x10;
      lVar32 = lVar32 + uVar24 * 4;
    }
    if ((int)local_1f8 == local_1a8 + -2) {
      local_2a0 = alVar91[0];
      local_1e8 = local_298;
    }
    for (iVar22 = 0; iVar22 != 2; iVar22 = iVar22 + 1) {
      lVar21 = local_240[uVar12][0];
      auVar88._0_8_ = local_278._0_8_;
      auVar88._8_4_ = local_278._0_4_;
      auVar88._12_4_ = local_278._4_4_;
      local_278._8_8_ = auVar88._8_8_;
      local_278._0_8_ = (long)-open;
      lVar38 = 0;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_268._0_8_;
      local_268 = auVar80 << 0x40;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = auVar39._0_8_;
      auVar39 = auVar86 << 0x40;
      auVar84._0_8_ = auVar83._0_8_;
      auVar84._8_4_ = auVar83._0_4_;
      auVar84._12_4_ = auVar83._4_4_;
      auVar83._8_8_ = auVar84._8_8_;
      auVar83._0_8_ = 1;
      lVar34 = local_198;
      for (lVar33 = 0; size << 4 != lVar33; lVar33 = lVar33 + 0x10) {
        plVar1 = (long *)((long)pvVar3 + lVar33 + lVar17);
        uVar37 = lVar38 + *plVar1;
        uVar55 = lVar21 + plVar1[1];
        auVar59 = *(undefined1 (*) [16])((long)*palVar15 + lVar33);
        auVar49._0_8_ = -(ulong)(local_278._0_8_ < auVar59._0_8_);
        auVar49._8_8_ = -(ulong)(local_278._8_8_ < auVar59._8_8_);
        auVar79 = blendvpd(local_278,auVar59,auVar49);
        *(undefined1 (*) [16])((long)*palVar15 + lVar33) = auVar79;
        uVar81 = auVar79._0_8_;
        auVar57._0_8_ = -(ulong)((-(ulong)(0 < (long)uVar37) & uVar37) == uVar81);
        uVar37 = auVar79._8_8_;
        auVar57._8_8_ = -(ulong)((-(ulong)(0 < (long)uVar55) & uVar55) == uVar37);
        auVar57 = auVar57 | auVar49;
        auVar63 = blendvpd(local_268,*(undefined1 (*) [16])((long)&local_248->score + lVar33),
                           auVar57);
        *(undefined1 (*) [16])((long)&local_248->score + lVar33) = auVar63;
        auVar78 = blendvpd(auVar39,*(undefined1 (*) [16])((long)*local_250 + lVar33),auVar57);
        *(undefined1 (*) [16])((long)*local_250 + lVar33) = auVar78;
        auVar66 = blendvpd(auVar83,*(undefined1 (*) [16])((long)*local_258 + lVar33),auVar57);
        *(undefined1 (*) [16])((long)*local_258 + lVar33) = auVar66;
        auVar50._0_8_ = -(ulong)(auVar63._0_8_ < local_208._0_8_);
        auVar50._8_8_ = -(ulong)(auVar63._8_8_ < local_208._8_8_);
        auVar59 = blendvpd(auVar63,local_208,auVar50);
        auVar51._0_8_ = -(ulong)(auVar78._0_8_ < auVar59._0_8_);
        auVar51._8_8_ = -(ulong)(auVar78._8_8_ < auVar59._8_8_);
        lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
        *(int *)(lVar38 + lVar34) = auVar63._0_4_;
        *(int *)((long)&ppVar25->score + lVar38 + lVar34) = auVar63._8_4_;
        auVar59 = blendvpd(auVar78,auVar59,auVar51);
        lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
        *(int *)(lVar38 + lVar34) = auVar78._0_4_;
        *(int *)((long)&ppVar25->score + lVar38 + lVar34) = auVar78._8_4_;
        auVar52._0_8_ = -(ulong)(auVar66._0_8_ < auVar59._0_8_);
        auVar52._8_8_ = -(ulong)(auVar66._8_8_ < auVar59._8_8_);
        lVar38 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
        *(int *)(lVar38 + lVar34) = auVar66._0_4_;
        *(int *)((long)&ppVar25->score + lVar38 + lVar34) = auVar66._8_4_;
        local_208 = blendvpd(auVar66,auVar59,auVar52);
        lVar38 = *((result->field_4).trace)->trace_del_table;
        *(int *)(lVar38 + lVar34) = auVar79._0_4_;
        *(int *)((long)&ppVar25->score + lVar38 + lVar34) = auVar79._8_4_;
        auVar53._0_8_ = -(ulong)(local_238._0_8_ < (long)uVar81);
        auVar53._8_8_ = -(ulong)(local_238._8_8_ < (long)uVar37);
        local_238 = blendvpd(local_238,auVar79,auVar53);
        lVar38 = local_278._0_8_ - uVar36;
        local_278._8_8_ = local_278._8_8_ - uStack_e0;
        local_278._0_8_ = lVar38;
        a_01[1] = (longlong)ppVar10;
        a_01[0] = uVar26;
        b_05[1] = (longlong)ppVar25;
        b_05[0] = (longlong)alVar91[0];
        ppVar19 = ppVar25;
        alVar91 = _mm_cmpgt_epi64_rpl(a_01,b_05);
        b_06[0] = alVar91[1];
        local_128._8_8_ = extraout_XMM0_Qb;
        local_128._0_8_ = extraout_XMM0_Qa;
        local_138._8_8_ = -(ulong)(local_278._8_8_ == uVar37 - uStack_60);
        local_138._0_8_ = -(ulong)(lVar38 == uVar81 - (uint)open);
        a_02[1] = (longlong)ppVar10;
        a_02[0] = uVar26;
        b_06[1] = (longlong)ppVar19;
        alVar91 = _mm_cmpgt_epi64_rpl(a_02,b_06);
        alVar91[0] = alVar91[1];
        local_128 = extraout_XMM0_02 & local_138 | local_128;
        if ((((((((((((((((local_128 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (local_128 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (local_128 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (local_128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_128 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (local_128 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_128 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (local_128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_128 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (local_128 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_128 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (local_128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_128 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (local_128 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_128 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_128[0xf]) goto LAB_0069325d;
        a_03[1] = (longlong)ppVar10;
        a_03[0] = uVar26;
        alVar91[1] = (longlong)ppVar19;
        alVar91 = _mm_cmpgt_epi64_rpl(a_03,alVar91);
        alVar91[0] = alVar91[1];
        local_268 = pblendvb(local_268,auVar63,extraout_XMM0_03);
        auVar39 = pblendvb(auVar39,auVar78,extraout_XMM0_03);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        local_d8 = auVar83._0_8_;
        lStack_d0 = auVar83._8_8_;
        auVar85._0_8_ = local_d8 + 1;
        auVar85._8_8_ = lStack_d0 - auVar58._8_8_;
        auVar62._0_8_ = auVar66._0_8_ + 1;
        auVar62._8_8_ = auVar66._8_8_ - auVar58._8_8_;
        auVar83 = pblendvb(auVar85,auVar62,extraout_XMM0_03);
        plVar1 = (long *)((long)*local_240 + lVar33);
        lVar38 = *plVar1;
        lVar21 = plVar1[1];
        lVar34 = lVar34 + uVar24 * 4;
      }
    }
LAB_0069325d:
    a_04[1] = (longlong)ppVar10;
    a_04[0] = uVar26;
    b_07[1] = (longlong)ppVar19;
    b_07[0] = (longlong)alVar91[0];
    _mm_cmpgt_epi64_rpl(a_04,b_07);
    local_218 = palVar13;
    alVar91[0] = local_240;
    ppVar10 = local_280;
    palVar11 = local_290;
    local_210 = ppVar14;
    local_240 = palVar15;
    if ((((((((((((((((extraout_XMM0_04 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (extraout_XMM0_04 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (extraout_XMM0_04 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (extraout_XMM0_04 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (extraout_XMM0_04 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (extraout_XMM0_04 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (extraout_XMM0_04 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (extraout_XMM0_04 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (extraout_XMM0_04 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (extraout_XMM0_04 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (extraout_XMM0_04 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (extraout_XMM0_04 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (extraout_XMM0_04 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (extraout_XMM0_04 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (extraout_XMM0_04 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        extraout_XMM0_04[0xf] < '\0') {
      lVar16 = local_238._8_8_;
      if ((long)local_238._8_8_ < (long)local_238._0_8_) {
        lVar16 = local_238._0_8_;
      }
      if ((long)(~(long)iVar8 + 0x7fffffffffffffffU) < lVar16) {
        *(byte *)&result->flag = (byte)result->flag | 0x40;
        local_298 = local_288;
        goto LAB_006933eb;
      }
      local_1f8 = uVar27 & 0xffffffff;
    }
    local_198 = local_198 + 4;
    local_298 = local_288;
    local_290 = local_258;
    local_288 = local_250;
    local_280 = local_248;
  }
  local_258 = local_290;
  local_250 = local_288;
  local_248 = local_280;
  local_1a8 = s2Len;
LAB_006933eb:
  palVar13 = local_240;
  ppVar25 = local_248;
  if (lVar16 != 0x7fffffffffffffff) {
    auVar54._0_8_ = -(ulong)(local_208._0_8_ == 0x7fffffffffffffff);
    auVar54._8_8_ = -(ulong)(local_208._8_8_ == 0x7fffffffffffffff);
    iVar8 = movmskpd(0xffffffff,auVar54);
    if (iVar8 == 0) goto LAB_0069343a;
  }
  *(byte *)&result->flag = (byte)result->flag | 0x40;
LAB_0069343a:
  iVar8 = parasail_result_is_saturated(result);
  iVar22 = 0;
  local_228 = palVar11;
  local_278._0_8_ = ppVar10;
  local_268._0_8_ = alVar91[0];
  if (iVar8 == 0) {
    if ((int)local_1f8 == local_1a8 + -1) {
      local_208._0_8_ = local_258;
      local_238._0_8_ = local_250;
      local_258 = local_218;
      local_250 = local_1e8;
      local_248 = local_210;
      local_240 = local_2a0;
      local_210 = ppVar25;
      local_2a0 = palVar13;
    }
    else if ((int)local_1f8 == local_1a8 + -2) {
      local_238._0_8_ = local_298;
      local_228 = local_218;
      local_298 = local_1e8;
      local_278._0_8_ = local_210;
      local_268._0_8_ = local_2a0;
      local_210 = ppVar10;
      local_2a0 = alVar91[0];
      local_208._0_8_ = palVar11;
    }
    else {
      local_208._0_8_ = local_218;
      local_238._0_8_ = local_1e8;
    }
    uVar24 = 0;
    uVar28 = 0;
    lVar21 = 0;
    while( true ) {
      iVar8 = (int)uVar28;
      iVar31 = (int)uVar9;
      if ((uVar7 & 0x3fffffff) * 2 == (int)uVar24) break;
      if ((*local_2a0)[uVar24] == lVar16) {
        uVar30 = 0;
        if ((uVar24 & 1) != 0) {
          uVar30 = uVar7;
        }
        uVar30 = uVar30 + ((uint)(uVar24 >> 1) & 0x7fffffff);
        if ((int)uVar30 < iVar31) {
          uVar28 = *(undefined8 *)(&local_210->score + uVar24 * 2);
          local_180 = ((longlong *)local_238._0_8_)[uVar24];
          lVar21 = ((longlong *)local_208._0_8_)[uVar24];
          uVar9 = (ulong)uVar30;
        }
      }
      uVar24 = uVar24 + 1;
    }
    iVar22 = (int)local_180;
    iVar29 = (int)lVar21;
    local_218 = (__m128i *)local_208._0_8_;
    local_1e8 = (__m128i *)local_238._0_8_;
  }
  else {
    iVar29 = 0;
    iVar8 = 0;
    lVar16 = 0;
    local_1f8._0_4_ = 0;
    iVar31 = 0;
  }
  result->score = (int)lVar16;
  result->end_query = iVar31;
  result->end_ref = (int)local_1f8;
  ((result->field_4).stats)->matches = iVar8;
  ((result->field_4).stats)->similar = iVar22;
  ((result->field_4).stats)->length = iVar29;
  parasail_free(local_218);
  parasail_free(local_1e8);
  parasail_free(local_210);
  parasail_free(local_2a0);
  parasail_free(b_02);
  parasail_free(b_01);
  parasail_free(b_00);
  parasail_free(b);
  parasail_free(local_228);
  parasail_free(local_258);
  parasail_free(local_298);
  parasail_free(local_250);
  parasail_free((void *)local_278._0_8_);
  parasail_free(local_248);
  parasail_free((void *)local_268._0_8_);
  parasail_free(local_240);
  return result;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}